

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O0

SDKConnection * __thiscall MyServer::OnIncomingConnection(MyServer *this,TonkAddress *address)

{
  element_type *peVar1;
  MyServer **in_RDI;
  SDKConnection *unaff_retaddr;
  SDKConnectionList<MyServerConnection> *in_stack_00000008;
  shared_ptr<MyServerConnection> ptr;
  __shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2> local_20 [2];
  
  std::make_shared<MyServerConnection,MyServer*>(in_RDI);
  std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::get(local_20);
  tonk::SDKConnectionList<MyServerConnection>::Insert(in_stack_00000008,unaff_retaddr);
  peVar1 = std::__shared_ptr<MyServerConnection,_(__gnu_cxx::_Lock_policy)2>::get(local_20);
  std::shared_ptr<MyServerConnection>::~shared_ptr((shared_ptr<MyServerConnection> *)0x1064f2);
  return &peVar1->super_SDKConnection;
}

Assistant:

tonk::SDKConnection* MyServer::OnIncomingConnection(
    const TonkAddress& address ///< Address of the client requesting a connection
)
{
    auto ptr = std::make_shared<MyServerConnection>(this);

    // Insert into connection list to prevent it from going out of scope
    ConnectionList.Insert(ptr.get());

    return ptr.get();
}